

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9GenCompileError(jx9_gen_state *pGen,sxi32 nErrType,sxu32 nLine,char *zFormat,...)

{
  char in_AL;
  SyBlob *pBlob;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined1 local_58 [8];
  va_list ap;
  char *local_38;
  char *zErr;
  SyBlob *pWorker;
  char *zFormat_local;
  sxu32 nLine_local;
  sxi32 nErrType_local;
  jx9_gen_state *pGen_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  pBlob = &(pGen->pVm->pEngine->xConf).sErrConsumer;
  local_38 = "Error";
  local_e8 = in_R8;
  local_e0 = in_R9;
  if ((nErrType == 1) && (pGen->nErr = pGen->nErr + 1, 0xf < pGen->nErr)) {
    SyBlobFormat(pBlob,"%u Error count limit reached, JX9 is aborting compilation\n",(ulong)nLine);
    pGen_local._4_4_ = -10;
  }
  else {
    if (nErrType == 2) {
      local_38 = "Warning";
    }
    else if (nErrType == 3) {
      local_38 = "Parse error";
    }
    else if (nErrType == 4) {
      local_38 = "Notice";
    }
    SyBlobFormat(pBlob,"%u %s: ",(ulong)nLine,local_38);
    ap[0].overflow_arg_area = local_108;
    ap[0]._0_8_ = &stack0x00000008;
    local_58._4_4_ = 0x30;
    local_58._0_4_ = 0x20;
    SyBlobFormatAp(pBlob,zFormat,(__va_list_tag *)local_58);
    SyBlobAppend(pBlob,"\n",1);
    pGen_local._4_4_ = 0;
  }
  return pGen_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9GenCompileError(jx9_gen_state *pGen,sxi32 nErrType,sxu32 nLine,const char *zFormat,...)
{
	SyBlob *pWorker = &pGen->pVm->pEngine->xConf.sErrConsumer;
	const char *zErr = "Error";
	va_list ap;
	if( nErrType == E_ERROR ){
		/* Increment the error counter */
		pGen->nErr++;
		if( pGen->nErr > 15 ){
			/* Error count limit reached */
			SyBlobFormat(pWorker, "%u Error count limit reached, JX9 is aborting compilation\n", nLine);	
			/* Abort immediately */
			return SXERR_ABORT;
		}
	}
	switch(nErrType){
	case E_WARNING: zErr = "Warning";     break;
	case E_PARSE:   zErr = "Parse error"; break;
	case E_NOTICE:  zErr = "Notice";      break;
	default:
		break;
	}
	/* Format the error message */
	SyBlobFormat(pWorker, "%u %s: ", nLine, zErr);
	va_start(ap, zFormat);
	SyBlobFormatAp(pWorker, zFormat, ap);
	va_end(ap);
	/* Append a new line */
	SyBlobAppend(pWorker, (const void *)"\n", sizeof(char));
	return JX9_OK;
}